

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O2

void processElements(XSNamedMap<xercesc_4_0::XSObject> *xsElements)

{
  long *plVar1;
  char *pcVar2;
  char *in_RAX;
  ulong uVar3;
  XSObject *xsObject;
  ostream *poVar4;
  XMLCh *toTranscode;
  ulong index;
  StrX local_38;
  
  if ((xsElements != (XSNamedMap<xercesc_4_0::XSObject> *)0x0) &&
     (uVar3 = *(ulong *)(*(long *)(xsElements + 0x10) + 0x10), uVar3 != 0)) {
    local_38.fLocalForm = in_RAX;
    for (index = 0; index < uVar3; index = index + 1) {
      xsObject = xercesc_4_0::XSNamedMap<xercesc_4_0::XSObject>::item(xsElements,index);
      printBasic(xsObject,"Element");
      plVar1 = *(long **)(xsObject + 0x38);
      poVar4 = std::operator<<((ostream *)&std::cout,"Content Model");
      std::operator<<(poVar4,"\n");
      std::operator<<((ostream *)&std::cout,"\tType:\t");
      pcVar2 = "\tComplex\n";
      if ((int)plVar1[5] == 0x10) {
        pcVar2 = "\tSimple\n";
      }
      std::operator<<((ostream *)&std::cout,pcVar2 + 1);
      poVar4 = std::operator<<((ostream *)&std::cout,"\tName:\t");
      toTranscode = (XMLCh *)(**(code **)(*plVar1 + 0x10))(plVar1);
      StrX::StrX(&local_38,toTranscode);
      std::operator<<(poVar4,local_38.fLocalForm);
      std::operator<<(poVar4,"\n");
      StrX::~StrX(&local_38);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "\n--------------------------------------------");
      std::endl<char,std::char_traits<char>>(poVar4);
      uVar3 = *(ulong *)(*(long *)(xsElements + 0x10) + 0x10);
    }
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"no elements\n\n");
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void processElements(XSNamedMap<XSObject> *xsElements)
{
    if (!xsElements || xsElements->getLength() == 0) {
        std::cout << "no elements\n\n"  << std::endl;
        return;
    }
    for (XMLSize_t i=0; i < xsElements->getLength(); i++) {
        XSElementDeclaration *xsElement = (XSElementDeclaration *)xsElements->item(i);
        printBasic(xsElement, "Element");

        // Content Model
        XSTypeDefinition *xsTypeDef = xsElement->getTypeDefinition();
        std::cout << "Content Model" << "\n";
        std::cout << "\tType:\t";
        if (xsTypeDef->getTypeCategory() == XSTypeDefinition::SIMPLE_TYPE) {
            std::cout << "Simple\n";
        } else {
            std::cout << "Complex\n";
        }
        std::cout << "\tName:\t"
            << StrX(xsTypeDef->getName()) << "\n";

        std::cout << "\n--------------------------------------------" << std::endl;
    }
}